

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O3

int pospopcnt_u16_avx512_harley_seal(uint16_t *data,uint32_t len,uint32_t *flags)

{
  pospopcnt_u16_avx512bw_harley_seal(data,len,flags);
  return 0;
}

Assistant:

int pospopcnt_u16_avx512_harley_seal(const uint16_t* data, uint32_t len, uint32_t* flags) { 
    #if defined(__AVX512BW__) && __AVX512BW__ == 1
    return pospopcnt_u16_avx512bw_harley_seal(data, len, flags);
    #elif defined(__AVX512VBMI__) && __AVX512VBMI__ == 1
    return pospopcnt_u16_avx512vbmi_harley_seal(data, len, flags);
    #else
    return(0);
    #endif
}